

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t main(wchar_t argc,char **argv)

{
  undefined8 *puVar1;
  char *pcVar2;
  _Bool _Var3;
  bool bVar4;
  byte bVar5;
  wchar_t wVar6;
  int iVar7;
  errr eVar8;
  _Bool *p_Var9;
  char *pcVar10;
  char *pcVar11;
  passwd *ppVar12;
  game_mode_type mode;
  bool bVar13;
  char *pcVar14;
  wchar_t wVar15;
  long lVar16;
  char configpath [512];
  char libpath [512];
  wchar_t local_664;
  char **local_658;
  char local_638 [511];
  undefined1 local_439;
  char local_438 [511];
  undefined1 local_239;
  char local_238 [511];
  undefined1 local_39;
  
  argv0 = *argv;
  umask(0x12);
  player_uid = getuid();
  safe_setuid_drop();
  my_strcpy(local_638,"./lib/",0x200);
  my_strcpy(local_238,"./lib/",0x200);
  my_strcpy(local_438,"./lib/",0x200);
  local_439 = 0;
  local_39 = 0;
  local_239 = 0;
  _Var3 = suffix(local_638,"/");
  if (!_Var3) {
    my_strcat(local_638,"/",0x200);
  }
  _Var3 = suffix(local_238,"/");
  if (!_Var3) {
    my_strcat(local_238,"/",0x200);
  }
  _Var3 = suffix(local_438,"/");
  if (!_Var3) {
    my_strcat(local_438,"/",0x200);
  }
  init_file_paths(local_638,local_238,local_438);
  local_658 = argv;
  if (argc < L'\x02') {
    pcVar10 = (char *)0x0;
    mode = GAME_LOAD;
  }
  else {
    wVar15 = L'\x01';
    pcVar10 = (char *)0x0;
    bVar4 = false;
    bVar5 = 0;
    local_664 = argc;
    do {
      pcVar11 = local_658[wVar15];
      pcVar2 = pcVar10;
      if (*pcVar11 != '-') {
        pcVar14 = pcVar11 + 1;
        bVar13 = true;
        goto switchD_00126494_caseD_65;
      }
      pcVar14 = pcVar11 + 2;
      bVar13 = true;
      switch(pcVar11[1]) {
      case 'c':
        bVar4 = true;
        break;
      case 'd':
        if (*pcVar14 == '\0') {
          quit_fmt("Try \'-d<dir>=<path>\'.");
        }
        pcVar10 = string_make(pcVar14);
        pcVar11 = strtok(pcVar10,"=");
        pcVar14 = strtok((char *)0x0,"=");
        lVar16 = 8;
        do {
          wVar6 = my_stricmp(pcVar11,*(char **)(&UNK_002c8978 + lVar16));
          if (wVar6 == L'\0') {
            puVar1 = *(undefined8 **)((long)&change_path_values[0].name + lVar16);
            string_free((char *)*puVar1);
            pcVar11 = string_make(pcVar14);
            *puVar1 = pcVar11;
            path_build(local_638,0x200,pcVar14,"");
            _Var3 = dir_create(local_638);
            if (!_Var3) {
              quit_fmt("Cannot create \'%s\'",local_638);
            }
            string_free(pcVar10);
            goto LAB_00126654;
          }
          lVar16 = lVar16 + 0x18;
        } while (lVar16 != 0x140);
        quit_fmt("Unrecognised -d parameter %s",pcVar11);
LAB_00126654:
        bVar13 = true;
        goto LAB_00126764;
      case 'e':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'v':
        goto switchD_00126494_caseD_65;
      case 'f':
        p_Var9 = &arg_force_name;
        goto LAB_00126579;
      case 'g':
        arg_graphics = L'\x02';
        if (*pcVar14 != '\0') {
          arg_graphics = atoi(pcVar14);
        }
        break;
      case 'l':
        list_saves();
        exit(0);
      case 'm':
        bVar13 = true;
        pcVar2 = pcVar14;
        if (*pcVar14 == '\0') goto switchD_00126494_caseD_65;
        goto LAB_00126764;
      case 'n':
        bVar5 = 1;
        bVar13 = true;
        break;
      case 'u':
        if (*pcVar14 == '\0') goto switchD_00126494_caseD_65;
        my_strcpy(arg_name,pcVar14,0x20);
        savefile_set_name(pcVar14,false,false);
        bVar13 = true;
        goto LAB_00126764;
      case 'w':
        p_Var9 = &arg_wizard;
LAB_00126579:
        *p_Var9 = true;
        break;
      default:
        if (pcVar11[1] != '-') goto switchD_00126494_caseD_65;
        pcVar11 = *local_658;
        local_658 = local_658 + wVar15;
        *local_658 = pcVar11;
        local_664 = local_664 - wVar15;
        bVar13 = false;
      }
      while (pcVar2 = pcVar10, *pcVar14 != '\0') {
switchD_00126494_caseD_65:
        puts("Usage: angband [options] [-- subopts]");
        puts("  -c             Select savefile with a menu; overrides -n");
        puts(
            "  -n             Start a new character (WARNING: overwrites default savefile without -u)"
            );
        puts("  -l             Lists all savefiles you can play");
        puts("  -w             Resurrect dead character (marks savefile)");
        puts("  -g             Request graphics mode");
        puts("  -u<who>        Use your <who> savefile");
        puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
        lVar16 = 8;
        do {
          printf("    %s (default is %s)\n",*(undefined8 *)(&UNK_002c8978 + lVar16),
                 **(undefined8 **)((long)&change_path_values[0].name + lVar16));
          lVar16 = lVar16 + 0x18;
        } while (lVar16 != 0x140);
        puts("                 Multiple -d options are allowed.");
        puts("  -m<sys>        Use module <sys>, where <sys> can be:");
        printf("     %s   %s\n","x11","Basic X11, subopts -d<display> -n<windows> -x<file>");
        printf("     %s   %s\n","spoil",
               "Spoiler generation mode, subopts\n              -a fname    Write artifact spoilers to fname;\n                          if neither -p, -r, nor -s are used, uses\n                          the standard artifacts\n              -m fname    Write brief monster spoilers to fname\n              -M fname    Write extended monster spoilers to fname\n              -o fname    Write object spoilers to fname\n              -p          Use the artifacts associated with the\n                          savefile set by main.c\n              -r fname    Use the randart file, fname, as the source\n                          of the artifacts; overrides -p or -s\n              -s seed     Use the given randart seed (hexadecimal\n                          value; no leading 0x) to generate the\n                          artifacts; causes the randart file and log\n                          to be generated as well; overrides -p"
              );
        quit((char *)0x0);
        wVar15 = L'\x02';
      }
LAB_00126764:
      pcVar10 = pcVar2;
    } while ((bVar13) && (wVar15 = wVar15 + L'\x01', wVar15 < local_664));
    mode = GAME_SELECT;
    if (!bVar4) {
      mode = (uint)bVar5;
    }
    if (!bVar13) goto LAB_001267c5;
  }
  local_658[1] = (char *)0x0;
  local_664 = L'\x01';
LAB_001267c5:
  quit_aux = quit_hook;
  if (pcVar10 != (char *)0x0) {
    ANGBAND_SYS = pcVar10;
  }
  pcVar11 = setlocale(0,"");
  if (pcVar11 != (char *)0x0) {
    pcVar11 = nl_langinfo(0xe);
    iVar7 = strcmp(pcVar11,"UTF-8");
    if (iVar7 != 0) {
      quit("Angband requires UTF-8 support");
    }
  }
  if (arg_name[0] == '\0') {
    ppVar12 = getpwuid(player_uid);
    if (((ppVar12 == (passwd *)0x0) || (pcVar11 = ppVar12->pw_name, pcVar11 == (char *)0x0)) ||
       (*pcVar11 == '\0')) {
      my_strcpy(arg_name,"PLAYER",0x20);
    }
    else {
      my_strcpy(arg_name,pcVar11,0x20);
      my_strcap(arg_name);
    }
    savefile_set_name(arg_name,true,false);
  }
  create_needed_dirs();
  lVar16 = 0;
  bVar4 = true;
  do {
    bVar13 = bVar4;
    pcVar11 = modules[lVar16].name;
    if (((pcVar10 == (char *)0x0) || (iVar7 = strcmp(pcVar10,pcVar11), iVar7 == 0)) &&
       (ANGBAND_SYS = pcVar11, eVar8 = (*modules[lVar16].init)(local_664,local_658), eVar8 == 0))
    goto LAB_001268f5;
    lVar16 = 1;
    bVar4 = false;
  } while (bVar13);
  quit("Unable to prepare any \'display module\'!");
LAB_001268f5:
  signals_init();
  cmd_get_hook = textui_get_cmd;
  reinit_hook = generic_reinit;
  init_display();
  init_angband();
  textui_init();
  pause_line(Term);
  play_game(mode);
  textui_cleanup();
  cleanup_angband();
  quit((char *)0x0);
  return L'\0';
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	bool new_game = false, select_game = false;
	bool done = false;

	const char *mstr = NULL;
	bool args = true;

	/* Save the "program name" XXX XXX XXX */
	argv0 = argv[0];

#ifdef UNIX

	/* Default permissions on files */
	(void)umask(022);

	/* Get the user id */
	player_uid = getuid();

#endif /* UNIX */

#ifdef SETGID

	/* Save the effective GID for later recall */
	player_egid = getegid();

#endif /* UNIX */


	/* Drop permissions */
	safe_setuid_drop();

	/* Get the file paths 
	 * Paths may be overriden by -d options, so this has to occur *before* 
	 * processing command line args */
	init_stuff();

	/* Process the command line arguments */
	for (i = 1; args && (i < argc); i++) {
		const char *arg = argv[i];

		/* Require proper options */
		if (*arg++ != '-') goto usage;

		/* Analyze option */
		switch (*arg++)
		{
			case 'c':
				select_game = true;
				break;

			case 'l':
				list_saves();
				exit(0);

			case 'n':
				new_game = true;
				break;

			case 'w':
				arg_wizard = true;
				break;

			case 'g':
				/* Default graphics tile */
				/* in graphics.txt, 2 corresponds to adam bolt's tiles */
				arg_graphics = 2; 
				if (*arg) arg_graphics = atoi(arg);
				break;

			case 'u': {
				if (!*arg) goto usage;

				my_strcpy(arg_name, arg, sizeof(arg_name));

				/* The difference here is because on setgid we have to be
				 * careful to only let the player have savefiles stored in
				 * the central save directory.  Sanitising input using
				 * player_safe_name() removes anything like that.
				 *
				 * But if the player is running with per-user saves, they
				 * can do whatever the hell they want.
				 */
#ifdef SETGID
				savefile_set_name(arg, true, false);
#else
				savefile_set_name(arg, false, false);
#endif /* SETGID */

				continue;
			}

			case 'f':
				arg_force_name = true;
				break;

			case 'm':
				if (!*arg) goto usage;
				mstr = arg;
				continue;
#ifdef SOUND
			case 's':
				if (!*arg) goto usage;
				soundstr = arg;
				continue;
#endif
			case 'd':
				change_path(arg);
				continue;

			case '-':
				argv[i] = argv[0];
				argc = argc - i;
				argv = argv + i;
				args = false;
				break;

			default:
			usage:
				puts("Usage: angband [options] [-- subopts]");
				puts("  -c             Select savefile with a menu; overrides -n");
				puts("  -n             Start a new character (WARNING: overwrites default savefile without -u)");
				puts("  -l             Lists all savefiles you can play");
				puts("  -w             Resurrect dead character (marks savefile)");
				puts("  -g             Request graphics mode");
				puts("  -u<who>        Use your <who> savefile");
				puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
				for (i = 0; i < (int)N_ELEMENTS(change_path_values); i++) {
#ifdef SETGID
					if (!change_path_values[i].setgid_ok) continue;
#endif
					printf("    %s (default is %s)\n", change_path_values[i].name, *change_path_values[i].path);
				}
				puts("                 Multiple -d options are allowed.");
#ifdef SOUND
				puts("  -s<mod>        Use sound module <sys>:");
				print_sound_help();
#endif
				puts("  -m<sys>        Use module <sys>, where <sys> can be:");

				/* Print the name and help for each available module */
				for (i = 0; i < (int)N_ELEMENTS(modules); i++)
					printf("     %s   %s\n",
					       modules[i].name, modules[i].help);

				/* Actually abort the process */
				quit(NULL);
		}
		if (*arg) goto usage;
	}

	/* Hack -- Forget standard args */
	if (args) {
		argc = 1;
		argv[1] = NULL;
	}

	/* Install "quit" hook */
	quit_aux = quit_hook;

	/* If we were told which mode to use, then use it */
	if (mstr)
		ANGBAND_SYS = mstr;
#if !defined(WINDOWS) && !defined(DJGPP)
	if (setlocale(LC_CTYPE, "")) {
		/* Require UTF-8 */
		if (!streq(nl_langinfo(CODESET), "UTF-8"))
			quit("Angband requires UTF-8 support");
	}
#endif

#ifdef UNIX

	/* Get the "user name" as default player name, unless set with -u switch */
	if (!arg_name[0]) {
		user_name(arg_name, sizeof(arg_name), player_uid);

		/* Sanitise name and set as savefile */
		savefile_set_name(arg_name, true, false);
	}

	/* Create any missing directories */
	create_needed_dirs();

#endif /* UNIX */

	/* Try the modules in the order specified by modules[] */
	for (i = 0; i < (int)N_ELEMENTS(modules); i++) {
		/* User requested a specific module? */
		if (!mstr || (streq(mstr, modules[i].name))) {
			ANGBAND_SYS = modules[i].name;
			if (0 == modules[i].init(argc, argv)) {
				done = true;
				break;
			}
		}
	}

	/* Make sure we have a display! */
	if (!done) quit("Unable to prepare any 'display module'!");

	/* Catch nasty signals */
	signals_init();

	/* Set up the command hook */
	cmd_get_hook = textui_get_cmd;

	/*
	 * Set action that needs to be done if restarting without exiting.
	 * Also need to do it now.
	 */
#ifdef SOUND
	saved_argc = argc;
	saved_argv = argv;
#endif
	reinit_hook = generic_reinit;
	generic_reinit();

	/* Set up the display handlers and things. */
	init_display();
	init_angband();
	textui_init();

	/* Wait for response */
	pause_line(Term);

	/* Play the game */
	play_game((select_game) ?
		GAME_SELECT : ((new_game) ? GAME_NEW : GAME_LOAD));

	/* Free resources */
	textui_cleanup();
	cleanup_angband();
#ifdef SOUND
	close_sound();
#endif

	/* Quit */
	quit(NULL);

	/* Exit */
	return (0);
}